

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_length.cc
# Opt level: O1

uint32_t __thiscall re2c::CatOp::fixedLength(CatOp *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (*this->exp1->_vptr_RegExp[4])();
  if ((iVar1 != -1) && (iVar2 = (*this->exp2->_vptr_RegExp[4])(), iVar2 != -1)) {
    return iVar2 + iVar1;
  }
  return 0xffffffff;
}

Assistant:

uint32_t CatOp::fixedLength ()
{
	const uint32_t l1 = exp1->fixedLength ();
	if (l1 != ~0u)
	{
		const uint32_t l2 = exp2->fixedLength ();
		if (l2 != ~0u)
		{
			return l1 + l2;
		}
	}
	return ~0u;
}